

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O2

MCodeChunk * jit_assemble(MCodeChunk *__return_storage_ptr__,Trace *trace)

{
  IrIns *pIVar1;
  void *pvVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  short sVar6;
  size_t i;
  ulong uVar7;
  char *__format;
  int reg;
  long lVar8;
  ushort uVar9;
  long lVar10;
  ulong uVar11;
  IrRef reg_end [16];
  
  iVar4 = trace->ir_count;
  pvVar2 = calloc((long)iVar4,2);
  uVar7 = (ulong)(iVar4 - 1);
  while( true ) {
    sVar6 = (short)uVar7;
    uVar5 = (ulong)(ushort)(sVar6 - 1);
    if (sVar6 == 0) break;
    uVar11 = trace->ir[uVar7 & 0xffff];
    uVar7 = uVar5;
    if ((uVar11 & 0xff00) != 0) {
      uVar5 = uVar11 >> 0x10 & 0xffff;
      if (*(short *)((long)pvVar2 + uVar5 * 2) == 0) {
        *(short *)((long)pvVar2 + uVar5 * 2) = sVar6;
      }
      uVar5 = uVar11 >> 0x20 & 0xffff;
      if (*(short *)((long)pvVar2 + uVar5 * 2) == 0) {
        *(short *)((long)pvVar2 + uVar5 * 2) = sVar6;
      }
    }
  }
  reg_end[8] = 0;
  reg_end[9] = 0;
  reg_end[10] = 0;
  reg_end[0xb] = 0;
  reg_end[0xc] = 0;
  reg_end[0xd] = 0;
  reg_end[0xe] = 0;
  reg_end[0xf] = 0;
  reg_end[0] = 0;
  reg_end[1] = 0;
  reg_end[2] = 0;
  reg_end[3] = 0;
  reg_end[4] = 0;
  reg_end[5] = 0;
  reg_end[6] = 0;
  reg_end[7] = 0;
  for (uVar3 = 1; uVar7 = (ulong)uVar3, (int)(uint)uVar3 < iVar4; uVar3 = uVar3 + 1) {
    pIVar1 = trace->ir;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      uVar9 = reg_end[lVar8];
      if (uVar9 == uVar3) {
        uVar9 = 0;
      }
      reg_end[lVar8] = uVar9;
    }
    lVar10 = 0;
    lVar8 = 0;
    while( true ) {
      if (lVar8 == 0x10) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/jit/asm/x64.c"
                      ,0x7a,"void asm_allocate_registers(Trace *)");
      }
      if (reg_end[lVar8] == 0) break;
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + -0x1000000000000;
    }
    pIVar1[uVar7] = (pIVar1[uVar7] & 0xffffffffffff) - lVar10;
    reg_end[lVar8] = *(IrRef *)((long)pvVar2 + uVar7 * 2);
  }
  asm_new();
  uVar7 = 1;
  do {
    if ((ulong)(long)trace->ir_count <= uVar7) {
      return __return_storage_ptr__;
    }
    pIVar1 = trace->ir;
    uVar5 = pIVar1[uVar7];
    if ((short)uVar5 == 0x100) {
      uVar11 = pIVar1[uVar5 >> 0x20 & 0xffff];
      if (uVar5 >> 0x30 != pIVar1[uVar5 >> 0x10 & 0xffff] >> 0x30) {
        printf("movsd xmm%d, xmm%d\n",uVar5 >> 0x30,pIVar1[uVar5 >> 0x10 & 0xffff] >> 0x30);
      }
      uVar11 = uVar11 >> 0x30;
      __format = "addsd xmm%d, xmm%d\n";
LAB_0010f8c8:
      printf(__format,uVar5 >> 0x30,uVar11);
    }
    else if (((uint)uVar5 & 0xffff) == 1) {
      printf("movsd xmm%d, [0x%zx]\n",uVar5 >> 0x30,
             (uVar5 >> 0xd & 0x7fffffff8) + (long)trace->vm->consts);
    }
    else if ((uVar5 & 0xffff) == 0) {
      iVar4 = (int)(uVar5 >> 0x10);
      if (iVar4 != 0) {
        uVar11 = (ulong)(uint)(iVar4 << 3);
        __format = "movsd xmm%d, [rdx + 0x%x]\n";
        goto LAB_0010f8c8;
      }
      printf("movsd xmm%d, [rdx]\n",uVar5 >> 0x30);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

MCodeChunk jit_assemble(Trace *trace) {
	// Perform register allocation first
	asm_allocate_registers(trace);

	// Create an empty machine code chunk
	MCodeChunk chunk = asm_new();

	// Assemble the IR instruction by instruction
	for (size_t i = 1; i < trace->ir_count; i++) {
		asm_ins(&chunk, trace, trace->ir[i]);
	}

	return chunk;
}